

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjEncodeYUVPlanes(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
                     uchar **dstPlanes,int *strides,int subsamp,int flags)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  JDIMENSION JVar6;
  int iVar7;
  void *__ptr;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uchar *puVar16;
  JDIMENSION JVar17;
  tjinstance *this;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  char *pcVar23;
  long lVar24;
  uint uVar25;
  uchar *_tmpbuf_aligned;
  size_t __n;
  int *piVar26;
  long *in_FS_OFFSET;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  JSAMPROW *tmpbuf2 [10];
  JSAMPROW *tmpbuf [10];
  JSAMPROW *outbuf [10];
  JSAMPLE *_tmpbuf2 [10];
  JSAMPLE *_tmpbuf [10];
  int pw [10];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  JDIMENSION aJStack_58 [10];
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  if ((*(byte *)((long)handle + 0x600) & 1) == 0) {
    pcVar23 = "tjEncodeYUVPlanes(): Instance has not been initialized for compression";
    __n = 0x47;
LAB_0010d170:
    memcpy((void *)((long)handle + 0x608),pcVar23,__n);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),pcVar23,__n);
  }
  else {
    uVar13 = (ulong)(uint)height;
    if ((((dstPlanes != (uchar **)0x0 &&
           ((uint)pixelFormat < 0xc &&
           ((0 < height && srcBuf != (uchar *)0x0) && (-1 < pitch && 0 < width)))) &&
         ((uint)subsamp < 6)) && (*dstPlanes != (uchar *)0x0)) &&
       ((subsamp == 3 || ((dstPlanes[1] != (uchar *)0x0 && (dstPlanes[2] != (uchar *)0x0)))))) {
      if (pixelFormat == 0xb) {
        pcVar23 = "tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels";
        __n = 0x41;
        goto LAB_0010d170;
      }
      if (pitch == 0) {
        pitch = tjPixelSize[(uint)pixelFormat] * width;
      }
      iVar5 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar5 != 0) goto LAB_0010d2b7;
      *(int *)((long)handle + 0x30) = width;
      *(int *)((long)handle + 0x34) = height;
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          pcVar23 = "JSIMD_FORCESSE=1";
          goto LAB_0010d3b4;
        }
        if ((flags & 0x20U) != 0) {
          pcVar23 = "JSIMD_FORCESSE2=1";
          goto LAB_0010d3b4;
        }
      }
      else {
        pcVar23 = "JSIMD_FORCEMMX=1";
LAB_0010d3b4:
        putenv(pcVar23);
      }
      uVar25 = 0xffffffff;
      setCompDefaults((jpeg_compress_struct *)handle,pixelFormat,subsamp,-1,flags);
      if (*(int *)((long)handle + 0x24) == 100) {
        (**(code **)(*handle + 0x20))(handle);
        jinit_c_master_control((j_compress_ptr)handle,0);
        jinit_color_converter((j_compress_ptr)handle);
        jinit_downsampler((j_compress_ptr)handle);
        (*(code *)**(undefined8 **)((long)handle + 0x1d8))(handle);
        iVar5 = *(int *)((long)handle + 0x138);
        uVar25 = *(uint *)((long)handle + 0x13c);
        uVar12 = -uVar25 & (uVar25 + height) - 1;
        __ptr = malloc((long)(int)uVar12 << 3);
        if (__ptr == (void *)0x0) {
          builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
          builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
          builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
          builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
          builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
          builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
          *(undefined4 *)((long)handle + 0x6d0) = 1;
          builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
          builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
          in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
          in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
          in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
          in_FS_OFFSET[-0x19] = 0x656e616c50565559;
          __ptr = (void *)0x0;
          uVar25 = 0xffffffff;
        }
        else {
          uVar14 = 1;
          if (1 < height) {
            uVar14 = (ulong)(uint)height;
          }
          uVar18 = 0;
          uVar20 = uVar18;
          do {
            uVar19 = uVar18;
            if ((flags & 2U) != 0) {
              uVar19 = (~uVar20 + uVar13) * (long)pitch;
            }
            *(uchar **)((long)__ptr + uVar20 * 8) = srcBuf + uVar19;
            auVar4 = _DAT_00160a40;
            auVar3 = _DAT_00160a30;
            uVar20 = uVar20 + 1;
            uVar18 = uVar18 + (long)pitch;
          } while (uVar14 != uVar20);
          if (height < (int)uVar12) {
            uVar10 = ~height + uVar12;
            auVar27._4_4_ = 0;
            auVar27._0_4_ = uVar10;
            auVar27._8_4_ = uVar10;
            auVar27._12_4_ = 0;
            uVar14 = 0;
            auVar27 = auVar27 ^ _DAT_00160a40;
            do {
              auVar28._8_4_ = (int)uVar14;
              auVar28._0_8_ = uVar14;
              auVar28._12_4_ = (int)(uVar14 >> 0x20);
              auVar28 = (auVar28 | auVar3) ^ auVar4;
              uVar2 = *(undefined8 *)((long)__ptr + uVar13 * 8 + -8);
              if ((bool)(~(auVar28._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar28._0_4_ ||
                          auVar27._4_4_ < auVar28._4_4_) & 1)) {
                *(undefined8 *)((long)__ptr + uVar14 * 8 + uVar13 * 8) = uVar2;
              }
              if ((auVar28._12_4_ != auVar27._12_4_ || auVar28._8_4_ <= auVar27._8_4_) &&
                  auVar28._12_4_ <= auVar27._12_4_) {
                *(undefined8 *)((long)__ptr + uVar14 * 8 + uVar13 * 8 + 8) = uVar2;
              }
              uVar14 = uVar14 + 2;
            } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar14);
          }
          iVar1 = *(int *)((long)handle + 0x4c);
          if (0 < (long)iVar1) {
            lVar24 = 0;
            do {
              lVar15 = *(long *)((long)handle + 0x58);
              lVar21 = lVar24 * 0x60;
              uVar10 = *(uint *)(lVar15 + 8 + lVar21);
              iVar7 = *(int *)(lVar15 + 0x1c + lVar21);
              uVar22 = (uint)(iVar5 * 8 * iVar7) / uVar10 + 0x1f & 0xffffffe0;
              pvVar8 = malloc((ulong)(uVar22 * uVar25 + 0x20));
              *(void **)(local_a8 + lVar24 * 8) = pvVar8;
              if (pvVar8 == (void *)0x0) {
LAB_0010d978:
                builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
                builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
                builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
                builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
                builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
                builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
                *(undefined4 *)((long)handle + 0x6d0) = 1;
                builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
                builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
                in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
                in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
                in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
                in_FS_OFFSET[-0x19] = 0x656e616c50565559;
                goto LAB_0010d9d0;
              }
              pvVar9 = malloc((long)(int)uVar25 * 8);
              *(void **)(local_198 + lVar24 * 8) = pvVar9;
              if (pvVar9 == (void *)0x0) goto LAB_0010d978;
              if (0 < (int)uVar25) {
                uVar13 = 0;
                do {
                  *(ulong *)(*(long *)(local_198 + lVar24 * 8) + uVar13 * 8) =
                       (ulong)(uVar22 * (int)uVar13) + ((long)pvVar8 + 0x1fU & 0xffffffffffffffe0);
                  uVar13 = uVar13 + 1;
                } while (uVar25 != uVar13);
              }
              uVar22 = iVar7 * 8 + 0x1fU & 0xffffffe0;
              iVar7 = *(int *)(lVar15 + lVar21 + 0xc);
              pvVar8 = malloc((ulong)(iVar7 * uVar22 + 0x20));
              *(void **)(local_f8 + lVar24 * 8) = pvVar8;
              if (pvVar8 == (void *)0x0) goto LAB_0010d978;
              pvVar9 = malloc((long)iVar7 * 8);
              *(void **)(local_1e8 + lVar24 * 8) = pvVar9;
              if (pvVar9 == (void *)0x0) goto LAB_0010d978;
              if (0 < iVar7) {
                uVar11 = 0;
                lVar15 = 0;
                do {
                  *(ulong *)(*(long *)(local_1e8 + lVar24 * 8) + lVar15 * 8) =
                       (ulong)uVar11 + ((long)pvVar8 + 0x1fU & 0xffffffffffffffe0);
                  lVar15 = lVar15 + 1;
                  uVar11 = uVar11 + uVar22;
                } while (iVar7 != lVar15);
              }
              JVar6 = (int)(uVar10 * (-iVar5 & (width + iVar5) - 1U)) / iVar5;
              aJStack_58[lVar24] = JVar6;
              uVar13 = (long)(int)(iVar7 * uVar12) / (long)(int)uVar25;
              iVar7 = (int)uVar13;
              pvVar8 = malloc((long)iVar7 << 3);
              *(void **)(local_148 + lVar24 * 8) = pvVar8;
              if (pvVar8 == (void *)0x0) goto LAB_0010d978;
              if (0 < iVar7) {
                puVar16 = dstPlanes[lVar24];
                uVar14 = 0;
                do {
                  *(uchar **)((long)pvVar8 + uVar14 * 8) = puVar16;
                  if ((strides == (int *)0x0) || (JVar17 = strides[lVar24], strides[lVar24] == 0)) {
                    JVar17 = JVar6;
                  }
                  puVar16 = puVar16 + (int)JVar17;
                  uVar14 = uVar14 + 1;
                } while ((uVar13 & 0xffffffff) != uVar14);
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != iVar1);
          }
          iVar5 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
          if (iVar5 == 0) {
            if (0 < (int)uVar12) {
              iVar5 = 0;
              do {
                (**(code **)(*(long *)((long)handle + 0x1d8) + 8))
                          (handle,(void *)((long)__ptr + (long)iVar5 * 8),local_198,0,
                           *(undefined4 *)((long)handle + 0x13c));
                (**(code **)(*(long *)((long)handle + 0x1e0) + 8))(handle,local_198,0,local_1e8,0);
                if (0 < *(int *)((long)handle + 0x4c)) {
                  piVar26 = (int *)(*(long *)((long)handle + 0x58) + 0xc);
                  lVar24 = 0;
                  do {
                    jcopy_sample_rows(*(JSAMPARRAY *)(local_1e8 + lVar24 * 8),0,
                                      *(JSAMPARRAY *)(local_148 + lVar24 * 8),
                                      (*piVar26 * iVar5) / *(int *)((long)handle + 0x13c),*piVar26,
                                      aJStack_58[lVar24]);
                    lVar24 = lVar24 + 1;
                    piVar26 = piVar26 + 0x18;
                  } while (lVar24 < *(int *)((long)handle + 0x4c));
                }
                iVar5 = iVar5 + *(int *)((long)handle + 0x13c);
              } while (iVar5 < (int)uVar12);
            }
            *(int *)((long)handle + 0x130) = *(int *)((long)handle + 0x130) + height;
            jpeg_abort_compress((j_compress_ptr)handle);
            uVar25 = 0;
          }
          else {
LAB_0010d9d0:
            uVar25 = 0xffffffff;
          }
        }
      }
      else {
        builtin_strncpy((char *)((long)handle + 0x628)," is in t",8);
        builtin_strncpy((char *)((long)handle + 0x630),"he wrong",8);
        builtin_strncpy((char *)((long)handle + 0x618),"s(): lib",8);
        builtin_strncpy((char *)((long)handle + 0x620),"jpeg API",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
        builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
        *(undefined8 *)((long)handle + 0x637) = 0x65746174732067;
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        *(undefined8 *)((long)in_FS_OFFSET + -0xa1) = 0x65746174732067;
        in_FS_OFFSET[-0x16] = 0x74206e6920736920;
        in_FS_OFFSET[-0x15] = 0x676e6f7277206568;
        in_FS_OFFSET[-0x18] = 0x62696c203a292873;
        in_FS_OFFSET[-0x17] = 0x495041206765706a;
        in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
        in_FS_OFFSET[-0x19] = 0x656e616c50565559;
        __ptr = (void *)0x0;
      }
      goto LAB_0010d2c1;
    }
    builtin_strncpy((char *)((long)handle + 0x618),"s(): Inv",8);
    builtin_strncpy((char *)((long)handle + 0x620),"alid arg",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
    builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
    *(undefined8 *)((long)handle + 0x626) = 0x746e656d756772;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined8 *)((long)in_FS_OFFSET + -0xb2) = 0x746e656d756772;
    in_FS_OFFSET[-0x18] = 0x766e49203a292873;
    in_FS_OFFSET[-0x17] = 0x6772612064696c61;
    in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
    in_FS_OFFSET[-0x19] = 0x656e616c50565559;
  }
LAB_0010d2b7:
  uVar25 = 0xffffffff;
  __ptr = (void *)0x0;
LAB_0010d2c1:
  if (100 < *(int *)((long)handle + 0x24)) {
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  free(__ptr);
  lVar24 = 0;
  do {
    free(*(void **)(local_198 + lVar24 * 8));
    free(*(void **)(local_a8 + lVar24 * 8));
    free(*(void **)(local_1e8 + lVar24 * 8));
    free(*(void **)(local_f8 + lVar24 * 8));
    free(*(void **)(local_148 + lVar24 * 8));
    lVar24 = lVar24 + 1;
  } while (lVar24 != 10);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar25;
}

Assistant:

DLLEXPORT int tjEncodeYUVPlanes(tjhandle handle, const unsigned char *srcBuf,
                                int width, int pitch, int height,
                                int pixelFormat, unsigned char **dstPlanes,
                                int *strides, int subsamp, int flags)
{
  JSAMPROW *row_pointer = NULL;
  JSAMPLE *_tmpbuf[MAX_COMPONENTS], *_tmpbuf2[MAX_COMPONENTS];
  JSAMPROW *tmpbuf[MAX_COMPONENTS], *tmpbuf2[MAX_COMPONENTS];
  JSAMPROW *outbuf[MAX_COMPONENTS];
  int i, retval = 0, row, pw0, ph0, pw[MAX_COMPONENTS], ph[MAX_COMPONENTS];
  JSAMPLE *ptr;
  jpeg_component_info *compptr;

  GET_CINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  _tmpbuf[i] = NULL;
    tmpbuf2[i] = NULL;  _tmpbuf2[i] = NULL;  outbuf[i] = NULL;
  }

  if ((this->init & COMPRESS) == 0)
    THROW("tjEncodeYUVPlanes(): Instance has not been initialized for compression");

  if (srcBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF || !dstPlanes ||
      !dstPlanes[0] || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROW("tjEncodeYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!dstPlanes[1] || !dstPlanes[2]))
    THROW("tjEncodeYUVPlanes(): Invalid argument");

  if (pixelFormat == TJPF_CMYK)
    THROW("tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  setCompDefaults(cinfo, pixelFormat, subsamp, -1, flags);

  /* Execute only the parts of jpeg_start_compress() that we need.  If we
     were to call the whole jpeg_start_compress() function, then it would try
     to write the file headers, which could overflow the output buffer if the
     YUV image were very small. */
  if (cinfo->global_state != CSTATE_START)
    THROW("tjEncodeYUVPlanes(): libjpeg API is in the wrong state");
  (*cinfo->err->reset_error_mgr) ((j_common_ptr)cinfo);
  jinit_c_master_control(cinfo, FALSE);
  jinit_color_converter(cinfo);
  jinit_downsampler(cinfo);
  (*cinfo->cconvert->start_pass) (cinfo);

  pw0 = PAD(width, cinfo->max_h_samp_factor);
  ph0 = PAD(height, cinfo->max_v_samp_factor);

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph0)) == NULL)
    THROW("tjEncodeYUVPlanes(): Memory allocation failure");
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = (JSAMPROW)&srcBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = (JSAMPROW)&srcBuf[i * (size_t)pitch];
  }
  if (height < ph0)
    for (i = height; i < ph0; i++) row_pointer[i] = row_pointer[height - 1];

  for (i = 0; i < cinfo->num_components; i++) {
    compptr = &cinfo->comp_info[i];
    _tmpbuf[i] = (JSAMPLE *)malloc(
      PAD((compptr->width_in_blocks * cinfo->max_h_samp_factor * DCTSIZE) /
          compptr->h_samp_factor, 32) *
      cinfo->max_v_samp_factor + 32);
    if (!_tmpbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    tmpbuf[i] =
      (JSAMPROW *)malloc(sizeof(JSAMPROW) * cinfo->max_v_samp_factor);
    if (!tmpbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < cinfo->max_v_samp_factor; row++) {
      unsigned char *_tmpbuf_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf[i], 32);

      tmpbuf[i][row] = &_tmpbuf_aligned[
        PAD((compptr->width_in_blocks * cinfo->max_h_samp_factor * DCTSIZE) /
            compptr->h_samp_factor, 32) * row];
    }
    _tmpbuf2[i] =
      (JSAMPLE *)malloc(PAD(compptr->width_in_blocks * DCTSIZE, 32) *
                        compptr->v_samp_factor + 32);
    if (!_tmpbuf2[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    tmpbuf2[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * compptr->v_samp_factor);
    if (!tmpbuf2[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < compptr->v_samp_factor; row++) {
      unsigned char *_tmpbuf2_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf2[i], 32);

      tmpbuf2[i][row] =
        &_tmpbuf2_aligned[PAD(compptr->width_in_blocks * DCTSIZE, 32) * row];
    }
    pw[i] = pw0 * compptr->h_samp_factor / cinfo->max_h_samp_factor;
    ph[i] = ph0 * compptr->v_samp_factor / cinfo->max_v_samp_factor;
    outbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i]);
    if (!outbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    ptr = dstPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      outbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < ph0; row += cinfo->max_v_samp_factor) {
    (*cinfo->cconvert->color_convert) (cinfo, &row_pointer[row], tmpbuf, 0,
                                       cinfo->max_v_samp_factor);
    (cinfo->downsample->downsample) (cinfo, tmpbuf, 0, tmpbuf2, 0);
    for (i = 0, compptr = cinfo->comp_info; i < cinfo->num_components;
         i++, compptr++)
      jcopy_sample_rows(tmpbuf2[i], 0, outbuf[i],
        row * compptr->v_samp_factor / cinfo->max_v_samp_factor,
        compptr->v_samp_factor, pw[i]);
  }
  cinfo->next_scanline += height;
  jpeg_abort_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) jpeg_abort_compress(cinfo);
  free(row_pointer);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(_tmpbuf[i]);
    free(tmpbuf2[i]);
    free(_tmpbuf2[i]);
    free(outbuf[i]);
  }
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}